

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

void __thiscall MPEGPictureHeader::MPEGPictureHeader(MPEGPictureHeader *this,int bufferSize)

{
  uint8_t *puVar1;
  
  (this->super_MPEGRawDataHeader).super_MPEGHeader._vptr_MPEGHeader =
       (_func_int **)&PTR__MPEGRawDataHeader_00241eb0;
  (this->super_MPEGRawDataHeader).m_headerIncludedToBuff = false;
  (this->super_MPEGRawDataHeader).m_data_buffer_len = 0;
  (this->super_MPEGRawDataHeader).m_max_data_len = bufferSize;
  if (bufferSize < 1) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    puVar1 = (uint8_t *)operator_new__((ulong)(uint)bufferSize);
  }
  (this->super_MPEGRawDataHeader).m_data_buffer = puVar1;
  (this->super_MPEGRawDataHeader).super_MPEGHeader._vptr_MPEGHeader =
       (_func_int **)&PTR__MPEGRawDataHeader_00241f08;
  *(undefined2 *)&(this->super_MPEGRawDataHeader).field_0x1c = 0;
  this->pict_type = FORBIDDEN;
  this->vbv_delay = 0;
  (this->bitReader).super_BitStream.m_totalBits = 0;
  (this->bitReader).super_BitStream.m_buffer = (uint *)0x0;
  (this->bitReader).super_BitStream.m_initBuffer = (uint *)0x0;
  (this->bitReader).m_curVal = 0;
  (this->bitReader).m_bitLeft = 0;
  this->full_pel[0] = 0;
  this->full_pel[1] = 0;
  this->f_code = '\0';
  this->extra_bit = '\0';
  *(uint8_t *)((long)(this->mpeg_f_code + 0) + 0) = '\0';
  *(uint8_t *)((long)(this->mpeg_f_code + 0) + 1) = '\0';
  *(uint8_t *)((long)(this->mpeg_f_code + 1) + 0) = '\0';
  *(uint8_t *)((long)(this->mpeg_f_code + 1) + 1) = '\0';
  this->intra_dc_precision = '\0';
  this->picture_structure = '\0';
  this->picture_structure = '\0';
  this->top_field_first = '\0';
  this->frame_pred_frame_dct = '\0';
  this->concealment_motion_vectors = '\0';
  this->q_scale_type = '\0';
  this->intra_vlc_format = '\0';
  this->alternate_scan = '\0';
  this->repeat_first_field = '\0';
  this->chroma_420_type = '\0';
  this->progressive_frame = '\0';
  this->composite_display_flag = '\0';
  this->v_axis = '\0';
  this->field_sequence = '\0';
  this->sub_carrier = '\0';
  this->burst_amplitude = '\0';
  this->sub_carrier_phase = '\0';
  this->horizontal_offset = 0;
  this->vertical_offset = 0;
  this->m_headerSize = 0;
  this->m_picture_data_len = 0;
  this->repeat_first_field_bitpos = 0;
  this->top_field_first_bitpos = 0;
  return;
}

Assistant:

MPEGPictureHeader::MPEGPictureHeader(const int bufferSize)
    : MPEGRawDataHeader(bufferSize),
      ref(0),
      pict_type(PictureCodingType::FORBIDDEN),
      vbv_delay(0),
      full_pel(),
      f_code(0),
      extra_bit(0),
      mpeg_f_code(),
      intra_dc_precision(0),
      picture_structure(0),
      top_field_first(0),
      frame_pred_frame_dct(0),
      concealment_motion_vectors(0),
      q_scale_type(0),
      intra_vlc_format(0),
      alternate_scan(0),
      chroma_420_type(0),
      progressive_frame(0),
      composite_display_flag(0),
      v_axis(0),
      field_sequence(0),
      sub_carrier(0),
      burst_amplitude(0),
      sub_carrier_phase(0),
      horizontal_offset(0),
      vertical_offset(0),
      m_headerSize(0),
      m_picture_data_len(0)
{
    repeat_first_field = 0;
    repeat_first_field_bitpos = 0;
    top_field_first_bitpos = 0;
}